

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  allocator<char> local_11a;
  allocator<char> local_119;
  SizedDeclarationsTypenameStyle1<glcts::ArraysOfArrays::Interface::GL> *local_118;
  TestShaderType local_10c;
  ulong local_108;
  undefined8 local_100;
  undefined8 local_f8;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string shader_source;
  
  local_100 = 1;
  local_108 = (ulong)tested_shader_type;
  local_f8 = 7;
  local_118 = this;
  local_10c = tested_shader_type;
  std::__cxx11::string::string((string *)&shader_source,(string *)shader_start_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"    float",&local_119);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"[2]",&local_11a);
  (*(local_118->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_b0,local_118,local_d0,local_70,local_100);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::string<std::allocator<char>>(local_f0," x",&local_119);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"[2]",&local_11a);
  (*(local_118->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
    super_TestNode._vptr_TestNode[6])(local_b0,local_118,local_f0,local_90,local_f8);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::append((char *)&shader_source);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_10c) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x5d7);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((long)&switchD_00b8c282::switchdataD_017226cc +
         (long)(int)(&switchD_00b8c282::switchdataD_017226cc)[local_108]) {
  case 0xb8c284:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 0xb8c295:
  case 0xb8c29c:
    std::__cxx11::string::append((string *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_017226e4 + *(int *)(&DAT_017226e4 + local_108 * 4)))
            (&DAT_017226e4 + *(int *)(&DAT_017226e4 + local_108 * 4),empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_);
  return;
}

Assistant:

void SizedDeclarationsTypenameStyle1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string shader_source = shader_start;

		shader_source += this->extend_string("    float", "[2]", max_dimension_index);
		shader_source += this->extend_string(" x", "[2]", API::MAX_ARRAY_DIMENSIONS - max_dimension_index);
		shader_source += ";\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int max_dimension_index = 1; ...) */
}